

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O0

int luaD_rawrunprotected(lua_State *L,Pfunc f,void *ud)

{
  undefined1 local_38 [8];
  lua_longjmp lj;
  unsigned_short oldnCcalls;
  void *ud_local;
  Pfunc f_local;
  lua_State *L_local;
  
  lj.status._2_2_ = L->nCcalls;
  lj.previous._4_4_ = 0;
  local_38 = (undefined1  [8])L->errorJmp;
  L->errorJmp = (lua_longjmp *)local_38;
  (*f)(L,ud);
  L->errorJmp = (lua_longjmp *)local_38;
  L->nCcalls = lj.status._2_2_;
  return lj.previous._4_4_;
}

Assistant:

int luaD_rawrunprotected (lua_State *L, Pfunc f, void *ud) {
  unsigned short oldnCcalls = L->nCcalls;
  struct lua_longjmp lj;
  lj.status = LUA_OK;
  lj.previous = L->errorJmp;  /* chain new error handler */
  L->errorJmp = &lj;
  LUAI_TRY(L, &lj,
    (*f)(L, ud);
  );
  L->errorJmp = lj.previous;  /* restore old error handler */
  L->nCcalls = oldnCcalls;
  return lj.status;
}